

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.c
# Opt level: O1

TCase * tcase_create(char *name)

{
  TCase *pTVar1;
  char *pcVar2;
  List *pLVar3;
  double dVar4;
  char *endptr;
  double local_20;
  char *local_18;
  
  pTVar1 = (TCase *)emalloc(0x48);
  pcVar2 = "";
  if (name != (char *)0x0) {
    pcVar2 = name;
  }
  pTVar1->name = pcVar2;
  pcVar2 = getenv("CK_DEFAULT_TIMEOUT");
  if (pcVar2 == (char *)0x0) {
    dVar4 = 4.0;
  }
  else {
    local_18 = (char *)0x0;
    dVar4 = strtod(pcVar2,&local_18);
    local_20 = 4.0;
    if (((dVar4 < 0.0) || (local_18 == pcVar2)) || (*local_18 != '\0')) goto LAB_001038c1;
  }
  local_20 = dVar4;
LAB_001038c1:
  pcVar2 = getenv("CK_TIMEOUT_MULTIPLIER");
  if (pcVar2 != (char *)0x0) {
    local_18 = (char *)0x0;
    dVar4 = strtod(pcVar2,&local_18);
    if (((0.0 <= dVar4) && (local_18 != pcVar2)) && (*local_18 == '\0')) {
      local_20 = local_20 * dVar4;
    }
  }
  dVar4 = floor(local_20);
  (pTVar1->timeout).tv_sec = (long)dVar4;
  (pTVar1->timeout).tv_nsec = (long)((local_20 - dVar4) * 1000000000.0);
  pLVar3 = check_list_create();
  pTVar1->tflst = pLVar3;
  pLVar3 = check_list_create();
  pTVar1->unch_sflst = pLVar3;
  pLVar3 = check_list_create();
  pTVar1->ch_sflst = pLVar3;
  pLVar3 = check_list_create();
  pTVar1->unch_tflst = pLVar3;
  pLVar3 = check_list_create();
  pTVar1->ch_tflst = pLVar3;
  pLVar3 = check_list_create();
  pTVar1->tags = pLVar3;
  return pTVar1;
}

Assistant:

TCase *tcase_create(const char *name)
{
    char *env;
    double timeout_sec = DEFAULT_TIMEOUT;

    TCase *tc = (TCase *)emalloc(sizeof(TCase)); /*freed in tcase_free */

    if(name == NULL)
        tc->name = "";
    else
        tc->name = name;

    env = getenv("CK_DEFAULT_TIMEOUT");
    if(env != NULL)
    {
        char *endptr = NULL;
        double tmp = strtod(env, &endptr);

        if(tmp >= 0 && endptr != env && (*endptr) == '\0')
        {
            timeout_sec = tmp;
        }
    }

    env = getenv("CK_TIMEOUT_MULTIPLIER");
    if(env != NULL)
    {
        char *endptr = NULL;
        double tmp = strtod(env, &endptr);

        if(tmp >= 0 && endptr != env && (*endptr) == '\0')
        {
            timeout_sec = timeout_sec * tmp;
        }
    }

    tc->timeout.tv_sec = (time_t) floor(timeout_sec);
    tc->timeout.tv_nsec =
        (long)((timeout_sec -
                floor(timeout_sec)) * (double)NANOS_PER_SECONDS);

    tc->tflst = check_list_create();
    tc->unch_sflst = check_list_create();
    tc->ch_sflst = check_list_create();
    tc->unch_tflst = check_list_create();
    tc->ch_tflst = check_list_create();
    tc->tags = check_list_create();

    return tc;
}